

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O0

int Signal::downsample(double *in,int inLength,double **out,int *outLength,int factor)

{
  double *pdVar1;
  int local_38;
  int i;
  int factor_local;
  int *outLength_local;
  double **out_local;
  int inLength_local;
  double *in_local;
  
  if (in == (double *)0x0) {
    printf("Input buffer is NULL! Aborting downsampling");
    in_local._4_4_ = -1;
  }
  else {
    *outLength = inLength / factor;
    if (*out == (double *)0x0) {
      pdVar1 = (double *)malloc((long)*outLength << 3);
      *out = pdVar1;
    }
    for (local_38 = 0; local_38 < inLength; local_38 = factor + local_38) {
      (*out)[local_38 / factor] = in[local_38];
    }
    in_local._4_4_ = 0;
  }
  return in_local._4_4_;
}

Assistant:

int Signal::downsample(double * in, int inLength, double ** out, int * outLength, int factor)
{
	int i;

	// Return error if the input signal is empty
	if (in == NULL)
	{
		printf("Input buffer is NULL! Aborting downsampling");
		return -1;
	}

	// Compute the output signal length
	*outLength = inLength / factor;

	// If the output signal is not allocated, allocate it
	if (*out == NULL)
	{
		*out = (double *)malloc(*outLength * sizeof(double));
	}

	// Perform the downsampling
	for (i = 0; i < inLength; i += factor)
	{
		(*out)[i / factor] = in[i];
	}

	return 0;
}